

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

void http1_destroy(fio_protocol_s *pr)

{
  http1pr_s *p;
  fio_protocol_s *pr_local;
  
  pr[3].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  http_s_destroy((http_s *)&pr[2].on_ready,'\0');
  fio_free(pr);
  return;
}

Assistant:

void http1_destroy(fio_protocol_s *pr) {
  http1pr_s *p = (http1pr_s *)pr;
  http1_pr2handle(p).status = 0;
  http_s_destroy(&http1_pr2handle(p), 0);
  fio_free(p);
  // FIO_LOG_DEBUG("Deallocated HTTP/1.1 protocol at. %p", (void *)p);
}